

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

void libxml_xmlParserCtxtErrorHandler(void *ctx,xmlError *error)

{
  undefined8 *puVar1;
  long *plVar2;
  PyObject *pPVar3;
  long *plVar4;
  int val;
  
  puVar1 = *(undefined8 **)((long)ctx + 0x1a8);
  if ((error->domain == 0x17) || (error->domain == 4)) {
    val = (error->level != XML_ERR_WARNING) + 1;
  }
  else {
    val = (error->level != XML_ERR_WARNING) + 3;
  }
  plVar2 = (long *)PyTuple_New(4);
  PyTuple_SetItem(plVar2,0,puVar1[1]);
  plVar4 = (long *)puVar1[1];
  if (plVar4 != (long *)0x0) {
    *plVar4 = *plVar4 + 1;
  }
  pPVar3 = libxml_constcharPtrWrap(error->message);
  PyTuple_SetItem(plVar2,1,pPVar3);
  pPVar3 = libxml_intWrap(val);
  PyTuple_SetItem(plVar2,2,pPVar3);
  PyTuple_SetItem(plVar2,3,&_Py_NoneStruct);
  __Py_NoneStruct = __Py_NoneStruct + 1;
  plVar4 = (long *)PyObject_CallObject(*puVar1,plVar2);
  if (plVar4 == (long *)0x0) {
    PyErr_Print();
  }
  if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
    _Py_Dealloc(plVar2);
  }
  if ((plVar4 != (long *)0x0) && (*plVar4 = *plVar4 + -1, *plVar4 == 0)) {
    _Py_Dealloc(plVar4);
    return;
  }
  return;
}

Assistant:

static void
libxml_xmlParserCtxtErrorHandler(void *ctx, const xmlError *error)
{
    PyObject *list;
    PyObject *result;
    xmlParserCtxtPtr ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;
    int severity;
    
    ctxt = (xmlParserCtxtPtr)ctx;
    pyCtxt = (xmlParserCtxtPyCtxtPtr)ctxt->_private;

    if ((error->domain == XML_FROM_VALID) ||
        (error->domain == XML_FROM_DTD)) {
        if (error->level == XML_ERR_WARNING)
            severity = XML_PARSER_SEVERITY_VALIDITY_WARNING;
        else
            severity = XML_PARSER_SEVERITY_VALIDITY_ERROR;
    } else {
        if (error->level == XML_ERR_WARNING)
            severity = XML_PARSER_SEVERITY_WARNING;
        else
            severity = XML_PARSER_SEVERITY_ERROR;
    }

    list = PyTuple_New(4);
    PyTuple_SetItem(list, 0, pyCtxt->arg);
    Py_XINCREF(pyCtxt->arg);
    PyTuple_SetItem(list, 1, libxml_constcharPtrWrap(error->message));
    PyTuple_SetItem(list, 2, libxml_intWrap(severity));
    PyTuple_SetItem(list, 3, Py_None);
    Py_INCREF(Py_None);
    result = PyObject_CallObject(pyCtxt->f, list);
    if (result == NULL) 
    {
	/* TODO: manage for the exception to be propagated... */
	PyErr_Print();
    }
    Py_XDECREF(list);
    Py_XDECREF(result);
}